

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr&,kj::StringPtr&,kj::StringPtr&,char,kj::StringPtr&,char>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,StringPtr *params_1,
          StringPtr *params_2,char *params_3,StringPtr *params_4,char *params_5)

{
  StringPtr *pSVar1;
  char *pcVar2;
  FixedArray<char,_1UL> *in_stack_ffffffffffffff60;
  char local_81 [1];
  ArrayPtr<const_char> local_80;
  char local_69 [1];
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  StringPtr *params_local_4;
  char *params_local_3;
  StringPtr *params_local_2;
  StringPtr *params_local_1;
  StringPtr *params_local;
  
  local_38 = (StringPtr *)params_3;
  params_local_4 = params_2;
  params_local_3 = (char *)params_1;
  params_local_2 = params;
  params_local_1 = (StringPtr *)this;
  params_local = (StringPtr *)__return_storage_ptr__;
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)this);
  local_48 = toCharSequence<kj::StringPtr&>(pSVar1);
  pSVar1 = fwd<kj::StringPtr&>(params_local_2);
  local_58 = toCharSequence<kj::StringPtr&>(pSVar1);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_local_3);
  local_68 = toCharSequence<kj::StringPtr&>(pSVar1);
  pcVar2 = fwd<char>((NoInfer<char> *)params_local_4);
  local_69[0] = (char)toCharSequence<char>(pcVar2);
  pSVar1 = fwd<kj::StringPtr&>(local_38);
  local_80 = toCharSequence<kj::StringPtr&>(pSVar1);
  pcVar2 = fwd<char>((NoInfer<char> *)params_4);
  local_81[0] = (char)toCharSequence<char>(pcVar2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)local_69,(FixedArray<char,_1UL> *)&local_80,
             (ArrayPtr<const_char> *)local_81,in_stack_ffffffffffffff60);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}